

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

void __thiscall llvm::detail::DoubleAPFloat::makeSmallest(DoubleAPFloat *this,bool Neg)

{
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    APFloat::makeSmallest
              ((this->Floats)._M_t.
               super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
               super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
               super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl,Neg);
    APFloat::makeZero((this->Floats)._M_t.
                      super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                      .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,false);
    return;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x108c,"void llvm::detail::DoubleAPFloat::makeSmallest(bool)");
}

Assistant:

void DoubleAPFloat::makeSmallest(bool Neg) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  Floats[0].makeSmallest(Neg);
  Floats[1].makeZero(/* Neg = */ false);
}